

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

int __thiscall
InitSocket::CbEnumIpAdressen
          (InitSocket *this,int iFamily,string *strIp,int nInterFaceId,void *vpUserParam)

{
  undefined1 auStack_68 [40];
  undefined1 local_40 [40];
  
  if (vpUserParam != (void *)0x0) {
    local_40._0_4_ = nInterFaceId;
    local_40._4_4_ = iFamily;
    std::__cxx11::string::string((string *)(local_40 + 8),(string *)strIp);
    std::
    tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
    ::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int,_true,_true>
              ((tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                *)auStack_68,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                *)local_40);
    std::
    vector<std::tuple<std::__cxx11::string_const,int,int>,std::allocator<std::tuple<std::__cxx11::string_const,int,int>>>
    ::emplace_back<std::tuple<std::__cxx11::string_const,int,int>>
              ((vector<std::tuple<std::__cxx11::string_const,int,int>,std::allocator<std::tuple<std::__cxx11::string_const,int,int>>>
                *)vpUserParam,
               (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                *)auStack_68);
    std::__cxx11::string::~string((string *)(auStack_68 + 8));
    std::__cxx11::string::~string((string *)(local_40 + 8));
  }
  return (uint)(vpUserParam == (void *)0x0);
}

Assistant:

int InitSocket::CbEnumIpAdressen(int iFamily, const string& strIp, int nInterFaceId, void* vpUserParam)
{
    if (vpUserParam == nullptr)
        return 1;   // Stop enumeration, doesn't make sense

    vector<tuple<const string, int, int>>* pmaStrIps = static_cast<vector<tuple<const string, int, int>>*>(vpUserParam);
    pmaStrIps->push_back(make_tuple(strIp, iFamily, nInterFaceId));

    return 0;
}